

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf.cpp
# Opt level: O1

bool duckdb::Leaf::DeprecatedGetRowIds
               (ART *art,Node *node,unsafe_vector<row_t> *row_ids,idx_t max_count)

{
  ulong uVar1;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var2;
  iterator __position;
  type paVar3;
  long *plVar4;
  pointer this;
  data_ptr_t pdVar5;
  long *plVar6;
  ulong uVar7;
  ulong uVar8;
  byte *__args;
  long lVar9;
  byte *pbVar10;
  
  do {
    uVar1 = (node->super_IndexPointer).data;
    if (uVar1 >> 0x38 == 0) break;
    paVar3 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(&art->allocators);
    _Var2._M_head_impl =
         paVar3->_M_elems[1].
         super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    plVar4 = *(long **)(*(long *)&((_Var2._M_head_impl)->buffers)._M_h +
                       ((uVar1 & 0xffffffff) %
                       *(size_type *)((long)&(_Var2._M_head_impl)->buffers + 8)) * 8);
    for (plVar6 = (long *)*plVar4; (uVar1 & 0xffffffff) != plVar6[1]; plVar6 = (long *)*plVar6) {
      plVar4 = plVar6;
    }
    this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
           operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                       *)(*plVar4 + 0x10));
    pdVar5 = FixedSizeBuffer::Get(this,false);
    lVar9 = (ulong)((uint)(uVar1 >> 0x20) & 0xffffff) * (_Var2._M_head_impl)->segment_size;
    uVar8 = (ulong)pdVar5[(_Var2._M_head_impl)->bitmask_offset + lVar9] +
            ((long)(row_ids->super_vector<long,_std::allocator<long>_>).
                   super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                   _M_finish -
             (long)(row_ids->super_vector<long,_std::allocator<long>_>).
                   super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                   _M_start >> 3);
    if (max_count < uVar8) break;
    pbVar10 = pdVar5 + (_Var2._M_head_impl)->bitmask_offset + lVar9;
    if (*pbVar10 != 0) {
      uVar7 = 0;
      __args = pbVar10;
      do {
        __args = __args + 8;
        __position._M_current =
             (row_ids->super_vector<long,_std::allocator<long>_>).
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (__position._M_current ==
            (row_ids->super_vector<long,_std::allocator<long>_>).
            super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          ::std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    ((vector<long,std::allocator<long>> *)row_ids,__position,(long *)__args);
        }
        else {
          *__position._M_current = *(long *)__args;
          (row_ids->super_vector<long,_std::allocator<long>_>).
          super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
               = __position._M_current + 1;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < *pbVar10);
    }
    node = (Node *)(pbVar10 + 0x28);
  } while (uVar8 <= max_count);
  return uVar1 >> 0x38 == 0;
}

Assistant:

bool Leaf::DeprecatedGetRowIds(ART &art, const Node &node, unsafe_vector<row_t> &row_ids, const idx_t max_count) {
	D_ASSERT(node.GetType() == LEAF);

	reference<const Node> ref(node);
	while (ref.get().HasMetadata()) {

		auto &leaf = Node::Ref<const Leaf>(art, ref, LEAF);
		if (row_ids.size() + leaf.count > max_count) {
			return false;
		}
		for (uint8_t i = 0; i < leaf.count; i++) {
			row_ids.push_back(leaf.row_ids[i]);
		}
		ref = leaf.ptr;
	}
	return true;
}